

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomResource::write(DomResource *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  aVar2._4_4_ = in_register_00000034;
  aVar2._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_40.d = (Data *)0x0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_40.ptr = L"resource";
    local_58.size = 0;
    local_40.size = 8;
  }
  else {
    QString::toLower_helper((QString *)&local_40);
  }
  QVar3.m_size = (size_t)local_40.ptr;
  QVar3.field_0.m_data = aVar2.m_data;
  QXmlStreamWriter::writeStartElement(QVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (this->m_has_attr_location == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"location",8);
    QVar5.field_0.m_data = (void *)(local_40.size | 0x8000000000000000);
    local_70.d = (this->m_attr_location).d.d;
    local_70.ptr = (this->m_attr_location).d.ptr;
    local_70.size = (this->m_attr_location).d.size;
    if (local_70.d != (Data *)0x0) {
      LOCK();
      ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar4.m_size = (size_t)local_40.ptr;
    QVar4.field_0.m_data = aVar2.m_data;
    QVar5.m_size = (size_t)local_70.ptr;
    QXmlStreamWriter::writeAttribute(QVar4,QVar5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomResource::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("resource") : tagName.toLower());

    if (hasAttributeLocation())
        writer.writeAttribute(u"location"_s, attributeLocation());

    writer.writeEndElement();
}